

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  
  pcVar3 = p;
  if ((this->_processEntities == true) && (bVar1 = *p, bVar1 != 0)) {
    do {
      if ((bVar1 < 0x40) && (this->_entityFlag[(ulong)bVar1 + (ulong)restricted * 0x40] == true)) {
        for (; p < pcVar3; p = p + uVar4) {
          uVar4 = (long)pcVar3 - (long)p;
          if (0x7ffffffe < uVar4) {
            uVar4 = 0x7fffffff;
          }
          Print(this,"%.*s",uVar4 & 0xffffffff);
        }
        lVar2 = 0;
        do {
          if ((&DAT_002674ec)[lVar2] == *pcVar3) {
            Print(this,"&%s;",*(undefined8 *)((long)&entities + lVar2));
            break;
          }
          lVar2 = lVar2 + 0x10;
        } while (lVar2 != 0x50);
        p = p + 1;
      }
      bVar1 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (bVar1 != 0);
  }
  if ((this->_processEntities == true) && (pcVar3 <= p)) {
    return;
  }
  Print(this,"%s",p);
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[(unsigned char)(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        // %.*s accepts type int as "precision"
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
                        Print( "%.*s", toPrint, p );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Print( "&%s;", entities[i].pattern );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
    }
    // Flush the remaining string. This will be the entire
    // string if an entity wasn't found.
    TIXMLASSERT( p <= q );
    if ( !_processEntities || ( p < q ) ) {
        Print( "%s", p );
    }
}